

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O1

int32_t __thiscall icu_63::FCDUTF8CollationIterator::getOffset(FCDUTF8CollationIterator *this)

{
  int32_t *piVar1;
  
  piVar1 = &(this->super_UTF8CollationIterator).pos;
  if (this->state == IN_NORMALIZED) {
    if (*piVar1 == 0) {
      piVar1 = &this->start;
    }
    else {
      piVar1 = &this->limit;
    }
  }
  return *piVar1;
}

Assistant:

int32_t
FCDUTF8CollationIterator::getOffset() const {
    if(state != IN_NORMALIZED) {
        return pos;
    } else if(pos == 0) {
        return start;
    } else {
        return limit;
    }
}